

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O2

void __thiscall duckdb::ColumnReader::PrepareDataPage(ColumnReader *this,PageHeader *page_hdr)

{
  shared_ptr<duckdb::ResizeableBuffer,_true> *psVar1;
  type tVar2;
  pointer pRVar3;
  uint uVar4;
  long lVar5;
  runtime_error *this_00;
  ResizeableBuffer *pRVar6;
  long lVar7;
  undefined8 unaff_RBP;
  ulong uVar8;
  uint64_t increment;
  uint8_t local_45;
  uint32_t rep_length;
  uint local_40;
  undefined4 local_3c;
  pointer local_38;
  
  tVar2 = page_hdr->type;
  if (tVar2 == DATA_PAGE) {
    if (((byte)page_hdr->__isset & 2) == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Missing data page header from data page");
      goto LAB_01de6b4e;
    }
    lVar7 = 0x20;
    lVar5 = 0x24;
LAB_01de6875:
    uVar8 = 0;
  }
  else {
    lVar7 = 0x100;
    lVar5 = 0x10c;
    if (tVar2 != DATA_PAGE_V2) goto LAB_01de6875;
    uVar8 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
    if (((byte)page_hdr->__isset & 0x10) == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"Missing data page header from data page v2");
      goto LAB_01de6b4e;
    }
  }
  this->page_rows_available = (long)*(int *)(&page_hdr->field_0x0 + lVar7);
  local_3c = *(undefined4 *)(&page_hdr->field_0x0 + lVar5);
  if (this->column_schema->max_repeat == 0) {
    if ((char)uVar8 != '\0') {
      if (0 < (page_hdr->data_page_header_v2).repetition_levels_byte_length) {
        pRVar6 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(&this->block);
        ByteBuffer::inc(&pRVar6->super_ByteBuffer,
                        (long)(page_hdr->data_page_header_v2).repetition_levels_byte_length);
      }
      goto LAB_01de6971;
    }
    if (this->column_schema->max_define == 0) goto LAB_01de6a46;
LAB_01de697c:
    if (tVar2 == DATA_PAGE) {
      pRVar6 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(&this->block);
      uVar4 = ByteBuffer::read<unsigned_int>(&pRVar6->super_ByteBuffer);
    }
    else {
      uVar4 = (page_hdr->data_page_header_v2).definition_levels_byte_length;
    }
    psVar1 = &this->block;
    rep_length = uVar4;
    pRVar6 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(psVar1);
    ByteBuffer::available(&pRVar6->super_ByteBuffer,(ulong)uVar4);
    pRVar6 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(psVar1);
    local_45 = RleBpDecoder::ComputeBitWidth(this->column_schema->max_define);
    make_uniq<duckdb::RleBpDecoder,unsigned_char*&,unsigned_int&,unsigned_char>
              ((duckdb *)&local_38,(uchar **)pRVar6,&rep_length,&local_45);
    pRVar3 = local_38;
    local_38 = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>::reset
              ((__uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_> *)
               &this->defined_decoder,pRVar3);
    ::std::unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>::~unique_ptr
              ((unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_> *)
               &local_38);
    pRVar6 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(psVar1);
    increment = (uint64_t)rep_length;
LAB_01de6a3e:
    ByteBuffer::inc(&pRVar6->super_ByteBuffer,increment);
  }
  else {
    local_40 = (uint)uVar8;
    if (tVar2 == DATA_PAGE) {
      pRVar6 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(&this->block);
      uVar4 = ByteBuffer::read<unsigned_int>(&pRVar6->super_ByteBuffer);
    }
    else {
      uVar4 = (page_hdr->data_page_header_v2).repetition_levels_byte_length;
    }
    psVar1 = &this->block;
    rep_length = uVar4;
    pRVar6 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(psVar1);
    ByteBuffer::available(&pRVar6->super_ByteBuffer,(ulong)uVar4);
    pRVar6 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(psVar1);
    local_45 = RleBpDecoder::ComputeBitWidth(this->column_schema->max_repeat);
    make_uniq<duckdb::RleBpDecoder,unsigned_char*&,unsigned_int&,unsigned_char>
              ((duckdb *)&local_38,(uchar **)pRVar6,&rep_length,&local_45);
    pRVar3 = local_38;
    local_38 = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>::reset
              ((__uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_> *)
               &this->repeated_decoder,pRVar3);
    ::std::unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>::~unique_ptr
              ((unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_> *)
               &local_38);
    pRVar6 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(psVar1);
    ByteBuffer::inc(&pRVar6->super_ByteBuffer,(ulong)rep_length);
    uVar8 = (ulong)local_40;
LAB_01de6971:
    if (this->column_schema->max_define != 0) goto LAB_01de697c;
    if (((char)uVar8 != '\0') && (0 < (page_hdr->data_page_header_v2).definition_levels_byte_length)
       ) {
      pRVar6 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(&this->block);
      increment = (uint64_t)(page_hdr->data_page_header_v2).definition_levels_byte_length;
      goto LAB_01de6a3e;
    }
  }
LAB_01de6a46:
  switch(local_3c) {
  case 0:
    this->encoding = PLAIN;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"Unsupported page encoding");
LAB_01de6b4e:
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  case 2:
  case 8:
    this->encoding = DICTIONARY;
    DictionaryDecoder::InitializePage(&this->dictionary_decoder);
    break;
  case 3:
    this->encoding = RLE;
    RLEDecoder::InitializePage(&this->rle_decoder);
    break;
  case 5:
    this->encoding = DELTA_BINARY_PACKED;
    DeltaBinaryPackedDecoder::InitializePage(&this->delta_binary_packed_decoder);
    break;
  case 6:
    this->encoding = DELTA_LENGTH_BYTE_ARRAY;
    DeltaLengthByteArrayDecoder::InitializePage(&this->delta_length_byte_array_decoder);
    break;
  case 7:
    this->encoding = DELTA_BYTE_ARRAY;
    DeltaByteArrayDecoder::InitializePage(&this->delta_byte_array_decoder);
    break;
  case 9:
    this->encoding = BYTE_STREAM_SPLIT;
    ByteStreamSplitDecoder::InitializePage(&this->byte_stream_split_decoder);
  }
  return;
}

Assistant:

void ColumnReader::PrepareDataPage(PageHeader &page_hdr) {
	if (page_hdr.type == PageType::DATA_PAGE && !page_hdr.__isset.data_page_header) {
		throw std::runtime_error("Missing data page header from data page");
	}
	if (page_hdr.type == PageType::DATA_PAGE_V2 && !page_hdr.__isset.data_page_header_v2) {
		throw std::runtime_error("Missing data page header from data page v2");
	}

	bool is_v1 = page_hdr.type == PageType::DATA_PAGE;
	bool is_v2 = page_hdr.type == PageType::DATA_PAGE_V2;
	auto &v1_header = page_hdr.data_page_header;
	auto &v2_header = page_hdr.data_page_header_v2;

	page_rows_available = is_v1 ? v1_header.num_values : v2_header.num_values;
	auto page_encoding = is_v1 ? v1_header.encoding : v2_header.encoding;

	if (HasRepeats()) {
		uint32_t rep_length = is_v1 ? block->read<uint32_t>() : v2_header.repetition_levels_byte_length;
		block->available(rep_length);
		repeated_decoder = make_uniq<RleBpDecoder>(block->ptr, rep_length, RleBpDecoder::ComputeBitWidth(MaxRepeat()));
		block->inc(rep_length);
	} else if (is_v2 && v2_header.repetition_levels_byte_length > 0) {
		block->inc(v2_header.repetition_levels_byte_length);
	}

	if (HasDefines()) {
		uint32_t def_length = is_v1 ? block->read<uint32_t>() : v2_header.definition_levels_byte_length;
		block->available(def_length);
		defined_decoder = make_uniq<RleBpDecoder>(block->ptr, def_length, RleBpDecoder::ComputeBitWidth(MaxDefine()));
		block->inc(def_length);
	} else if (is_v2 && v2_header.definition_levels_byte_length > 0) {
		block->inc(v2_header.definition_levels_byte_length);
	}

	switch (page_encoding) {
	case Encoding::RLE_DICTIONARY:
	case Encoding::PLAIN_DICTIONARY: {
		encoding = ColumnEncoding::DICTIONARY;
		dictionary_decoder.InitializePage();
		break;
	}
	case Encoding::RLE: {
		encoding = ColumnEncoding::RLE;
		rle_decoder.InitializePage();
		break;
	}
	case Encoding::DELTA_BINARY_PACKED: {
		encoding = ColumnEncoding::DELTA_BINARY_PACKED;
		delta_binary_packed_decoder.InitializePage();
		break;
	}
	case Encoding::DELTA_LENGTH_BYTE_ARRAY: {
		encoding = ColumnEncoding::DELTA_LENGTH_BYTE_ARRAY;
		delta_length_byte_array_decoder.InitializePage();
		break;
	}
	case Encoding::DELTA_BYTE_ARRAY: {
		encoding = ColumnEncoding::DELTA_BYTE_ARRAY;
		delta_byte_array_decoder.InitializePage();
		break;
	}
	case Encoding::BYTE_STREAM_SPLIT: {
		encoding = ColumnEncoding::BYTE_STREAM_SPLIT;
		byte_stream_split_decoder.InitializePage();
		break;
	}
	case Encoding::PLAIN:
		// nothing to do here, will be read directly below
		encoding = ColumnEncoding::PLAIN;
		break;

	default:
		throw std::runtime_error("Unsupported page encoding");
	}
}